

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_user_resp(connectdata *conn,int pop3code,pop3state instate)

{
  char *local_38;
  Curl_easy *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  if (pop3code == 0x2b) {
    if (conn->passwd == (char *)0x0) {
      local_38 = "";
    }
    else {
      local_38 = conn->passwd;
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PASS %s",local_38);
  }
  else {
    Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,POP3_PASS);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_user_resp(struct connectdata *conn, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* Send the PASS command */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "PASS %s",
                           conn->passwd ? conn->passwd : "");
  if(!result)
    state(conn, POP3_PASS);

  return result;
}